

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult * __thiscall
iutest::internal::
CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
          (AssertionResult *__return_storage_ptr__,internal *this,char *expected_str,
          char *actual_str,basic_string_view<char,_std::char_traits<char>_> *expected,
          basic_string_view<char,_std::char_traits<char>_> *actual)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *v;
  basic_string_view<char,_std::char_traits<char>_> *v_00;
  string sStack_68;
  string local_48;
  
  bVar1 = iuOperatorEQ<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                    (expected,(basic_string_view<char,_std::char_traits<char>_> *)actual_str);
  if (bVar1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    PrintToString<std::basic_string_view<char,std::char_traits<char>>>
              (&local_48,(iutest *)actual_str,v);
    PrintToString<std::basic_string_view<char,std::char_traits<char>>>
              (&sStack_68,(iutest *)expected,v_00);
    EqFailure(__return_storage_ptr__,(char *)this,expected_str,&local_48,&sStack_68,false);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

IUTEST_COND_LIKELY( iuOperatorEQ(actual, expected) )
    {
        return AssertionSuccess();
    }